

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::ExtensionMethodName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *descriptor)

{
  allocator<char> local_99;
  string local_98;
  string local_68;
  string *local_48;
  string *result;
  string *local_20;
  string *name;
  FieldDescriptor *descriptor_local;
  
  name = (string *)this;
  descriptor_local = (FieldDescriptor *)__return_storage_ptr__;
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            ((string *)&result,(_anonymous_namespace_ *)this,descriptor);
  local_20 = (string *)&result;
  anon_unknown_0::UnderscoresToCamelCase(&local_68,(string *)&result,false);
  local_48 = &local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"_Extension",&local_99);
  anon_unknown_0::SanitizeNameForObjC(__return_storage_ptr__,&local_68,&local_98,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

string ExtensionMethodName(const FieldDescriptor* descriptor) {
  const string& name = NameFromFieldDescriptor(descriptor);
  const string& result = UnderscoresToCamelCase(name, false);
  return SanitizeNameForObjC(result, "_Extension", NULL);
}